

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

string * __thiscall
pbrt::RandomWalkIntegrator::ToString_abi_cxx11_
          (string *__return_storage_ptr__,RandomWalkIntegrator *this)

{
  int *in_RCX;
  
  StringPrintf<int_const&>
            (__return_storage_ptr__,(pbrt *)"[ RandomWalkIntegrator maxDepth: %d ]",
             (char *)&this->maxDepth,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string RandomWalkIntegrator::ToString() const {
    return StringPrintf("[ RandomWalkIntegrator maxDepth: %d ]", maxDepth);
}